

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O3

void __thiscall MeshDenoisingViaL0Minimization::denoise(MeshDenoisingViaL0Minimization *this)

{
  DenseIndex *pDVar1;
  uint *area_based_edge_operator_00;
  undefined1 *__src;
  ParameterSet *pPVar2;
  DataManager *pDVar3;
  bool bVar4;
  MeshDenoisingViaL0Minimization *pMVar5;
  undefined1 local_330 [8];
  TriMesh mesh;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  area_based_edge_operator;
  undefined1 auStack_e8 [8];
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  edge_vertex_handle;
  undefined1 auStack_c8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  coef;
  undefined1 auStack_a8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> delta;
  double local_88;
  double mu_beta;
  double mu_alpha;
  double lambda;
  double beta_max;
  double alpha;
  double beta;
  MatrixXd initial_vertices_matrix;
  
  DataManager::getNoisyMesh((TriMesh *)local_330,(this->super_MeshDenoisingBase).data_manager_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ !=
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
    pDVar1 = &initial_vertices_matrix.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    beta = (double)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&beta,"mu_beta","");
    bVar4 = ParameterSet::getValue(pPVar2,(string *)&beta,&local_88);
    if ((DenseIndex *)beta != pDVar1) {
      operator_delete((void *)beta);
    }
    if (bVar4) {
      pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
      beta = (double)pDVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&beta,"beta","");
      bVar4 = ParameterSet::getValue(pPVar2,(string *)&beta,&alpha);
      if ((DenseIndex *)beta != pDVar1) {
        operator_delete((void *)beta);
      }
      if (bVar4) {
        pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
        beta = (double)pDVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&beta,"beta_max","");
        bVar4 = ParameterSet::getValue(pPVar2,(string *)&beta,&lambda);
        if ((DenseIndex *)beta != pDVar1) {
          operator_delete((void *)beta);
        }
        if (bVar4) {
          pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
          beta = (double)pDVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&beta,"mu_alpha","");
          bVar4 = ParameterSet::getValue(pPVar2,(string *)&beta,&mu_beta);
          if ((DenseIndex *)beta != pDVar1) {
            operator_delete((void *)beta);
          }
          if (bVar4) {
            pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
            beta = (double)pDVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&beta,"alpha","");
            bVar4 = ParameterSet::getValue(pPVar2,(string *)&beta,&beta_max);
            if ((DenseIndex *)beta != pDVar1) {
              operator_delete((void *)beta);
            }
            if (bVar4) {
              pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
              beta = (double)pDVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&beta,"lambda","");
              bVar4 = ParameterSet::getValue(pPVar2,(string *)&beta,&mu_alpha);
              pMVar5 = (MeshDenoisingViaL0Minimization *)beta;
              if ((DenseIndex *)beta != pDVar1) {
                operator_delete((void *)beta);
              }
              if (bVar4) {
                beta = 0.0;
                initial_vertices_matrix.
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
                     (double *)0x0;
                initial_vertices_matrix.
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
                     0;
                getInitialVerticesMatrix(pMVar5,(TriMesh *)local_330,(MatrixXd *)&beta);
                mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .refcount_fcolors_ = 0;
                mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .refcount_ftextureIndex_ = 0;
                edge_vertex_handle.
                super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                auStack_e8 = (undefined1  [8])0x0;
                edge_vertex_handle.
                super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                coef.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                auStack_c8 = (undefined1  [8])0x0;
                coef.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                delta.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                auStack_a8 = (undefined1  [8])0x0;
                delta.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                if (alpha < lambda) {
                  area_based_edge_operator_00 =
                       &mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .refcount_fcolors_;
                  do {
                    pMVar5 = this;
                    calculateAreaBasedEdgeOperator
                              (this,(TriMesh *)local_330,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)area_based_edge_operator_00,
                               (vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                                *)auStack_e8,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)auStack_c8);
                    solveDelta(pMVar5,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       *)area_based_edge_operator_00,mu_alpha,alpha,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)auStack_a8);
                    solveVertices(pMVar5,(TriMesh *)local_330,(MatrixXd *)&beta,
                                  (vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                                   *)auStack_e8,
                                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)auStack_c8,
                                  (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   *)auStack_a8,beta_max,alpha);
                    alpha = local_88 * alpha;
                    beta_max = mu_beta * beta_max;
                  } while (alpha < lambda);
                }
                pDVar3 = (this->super_MeshDenoisingBase).data_manager_;
                OpenMesh::PolyConnectivity::operator=
                          ((PolyConnectivity *)&pDVar3->mesh_,(PolyConnectivity *)local_330);
                __src = &mesh.super_Mesh.
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         .field_0x19c;
                memcpy(&(pDVar3->mesh_).super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .points_,__src,0x84);
                pDVar3 = (this->super_MeshDenoisingBase).data_manager_;
                OpenMesh::PolyConnectivity::operator=
                          ((PolyConnectivity *)&pDVar3->denoised_mesh_,(PolyConnectivity *)local_330
                          );
                memcpy(&(pDVar3->denoised_mesh_).super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .points_,__src,0x84);
                if (auStack_a8 != (undefined1  [8])0x0) {
                  operator_delete((void *)auStack_a8);
                }
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)auStack_c8);
                std::
                vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                           *)auStack_e8);
                if (mesh.super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    ._544_8_ != 0) {
                  operator_delete((void *)mesh.super_Mesh.
                                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                          .
                                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                          ._544_8_);
                }
                free((void *)beta);
              }
            }
          }
        }
      }
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_330);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // get parameters
    double mu_beta, beta, beta_max;
    if(!parameter_set_->getValue(string("mu_beta"), mu_beta))
        return;
    if(!parameter_set_->getValue(string("beta"), beta))
        return;
    if(!parameter_set_->getValue(string("beta_max"), beta_max))
        return;
    double mu_alpha, alpha;
    if(!parameter_set_->getValue(string("mu_alpha"), mu_alpha))
        return;
    if(!parameter_set_->getValue(string("alpha"), alpha))
        return;
    double lambda;
    if(!parameter_set_->getValue(string("lambda"), lambda))
        return;

    // do optimization
    Eigen::MatrixXd initial_vertices_matrix;
    getInitialVerticesMatrix(mesh, initial_vertices_matrix);

    std::vector<TriMesh::Point> area_based_edge_operator;
    std::vector< std::vector<TriMesh::VertexHandle> > edge_vertex_handle;
    std::vector< std::vector<double> > coef;
    std::vector<TriMesh::Point> delta;

    while(beta < beta_max){
        calculateAreaBasedEdgeOperator(mesh, area_based_edge_operator, edge_vertex_handle, coef);
        // update delta
        solveDelta(area_based_edge_operator, lambda, beta, delta);
        // update vertices
        solveVertices(mesh, initial_vertices_matrix, edge_vertex_handle, coef, delta, alpha, beta);
        beta *= mu_beta;
        alpha *= mu_alpha;
    }

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}